

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_stream_socket.c
# Opt level: O0

void oonf_stream_copy_managed_config
               (oonf_stream_managed_config *dst,oonf_stream_managed_config *src)

{
  oonf_stream_managed_config *src_local;
  oonf_stream_managed_config *dst_local;
  
  oonf_stream_free_managed_config(dst);
  memcpy(dst,src,0x68);
  memset(dst,0,0x28);
  netaddr_acl_copy(dst);
  memset(&dst->bindto,0,0x28);
  netaddr_acl_copy(&dst->bindto,&src->bindto);
  return;
}

Assistant:

void
oonf_stream_copy_managed_config(struct oonf_stream_managed_config *dst, struct oonf_stream_managed_config *src) {
  oonf_stream_free_managed_config(dst);

  memcpy(dst, src, sizeof(*dst));

  memset(&dst->acl, 0, sizeof(dst->acl));
  netaddr_acl_copy(&dst->acl, &src->acl);

  memset(&dst->bindto, 0, sizeof(dst->bindto));
  netaddr_acl_copy(&dst->bindto, &src->bindto);
}